

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O0

void __thiscall xray_re::way_path_io::operator()(way_path_io *this,way_path **_path,xr_reader *r)

{
  uint16_t uVar1;
  way_path *pwVar2;
  size_t sVar3;
  way_point_vec *this_00;
  reference point;
  way_point_io_12 local_75 [13];
  way_point local_68;
  uint local_34;
  uint local_30;
  int i;
  int n;
  uint16_t version;
  way_path *path;
  xr_reader *r_local;
  way_path **_path_local;
  way_path_io *this_local;
  
  path = (way_path *)r;
  r_local = (xr_reader *)_path;
  _path_local = (way_path **)this;
  pwVar2 = (way_path *)operator_new(0x50);
  way_path::way_path(pwVar2);
  r_local->_vptr_xr_reader = (_func_int **)pwVar2;
  _n = pwVar2;
  sVar3 = xr_reader::r_chunk<unsigned_short>((xr_reader *)path,1,(unsigned_short *)((long)&i + 2));
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,0x3a,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  if (i._2_2_ != 0x13 && i._2_2_ != 0x12) {
    __assert_fail("version == WAYOBJECT_VERSION || version == WAYOBJECT_VERSION_12",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,0x3b,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  sVar3 = xr_reader::find_chunk((xr_reader *)path,2);
  pwVar2 = path;
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,0x3e,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  if (i._2_2_ == 0x12) {
    uVar1 = xr_reader::r_u16((xr_reader *)path);
    local_30 = (uint)uVar1;
    std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::reserve
              (&_n->points,(long)(int)local_30);
    for (local_34 = 0; local_34 != local_30; local_34 = local_34 + 1) {
      this_00 = &_n->points;
      local_68.position.field_0._0_8_ = 0;
      local_68._40_8_ = 0;
      local_68.name.field_2._M_allocated_capacity = 0;
      local_68.name.field_2._8_8_ = 0;
      local_68.name._M_dataplus = (_Alloc_hider)0x0;
      local_68.name._1_7_ = 0;
      local_68.name._M_string_length = 0;
      way_point::way_point(&local_68);
      std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::push_back
                (this_00,&local_68);
      way_point::~way_point(&local_68);
      point = std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::back
                        (&_n->points);
      way_point_io_12::operator()(local_75,point,(xr_reader *)path,local_34);
    }
  }
  else {
    if (i._2_2_ != 0x13) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                    ,0x4e,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
    }
    uVar1 = xr_reader::r_u16((xr_reader *)path);
    xr_reader::
    r_seq<std::vector<xray_re::way_point,std::allocator<xray_re::way_point>>,xray_re::way_point_io>
              ((xr_reader *)pwVar2,uVar1,&_n->points);
  }
  xr_reader::debug_find_chunk((xr_reader *)path);
  sVar3 = xr_reader::find_chunk((xr_reader *)path,3);
  pwVar2 = path;
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,0x54,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  if (i._2_2_ == 0x12) {
    uVar1 = xr_reader::r_u16((xr_reader *)path);
    xr_reader::
    r_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io_12>
              ((xr_reader *)pwVar2,uVar1,&_n->links);
  }
  else {
    if (i._2_2_ != 0x13) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                    ,0x5e,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
    }
    uVar1 = xr_reader::r_u16((xr_reader *)path);
    xr_reader::
    r_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
              ((xr_reader *)pwVar2,uVar1,&_n->links);
  }
  xr_reader::debug_find_chunk((xr_reader *)path);
  sVar3 = xr_reader::find_chunk((xr_reader *)path,5);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,100,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  xr_reader::r_sz((xr_reader *)path,&_n->name);
  xr_reader::debug_find_chunk((xr_reader *)path);
  return;
}

Assistant:

void way_path_io::operator()(way_path*& _path, xr_reader& r) const
{
	way_path* path = new way_path;
	_path = path;
	uint16_t version;
	if (!r.r_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WAYOBJECT_VERSION || version == WAYOBJECT_VERSION_12);

	if (!r.find_chunk(WAYOBJECT_CHUNK_POINTS))
		xr_not_expected();

	switch(version) {
	case WAYOBJECT_VERSION:
		r.r_seq(r.r_u16(), path->points, way_point_io());
		break;
	case WAYOBJECT_VERSION_12: {
		int n = r.r_u16();
		path->points.reserve(n);
		for (int i = 0; i != n; i++) {
			path->points.push_back(way_point());
			way_point_io_12()(path->points.back(), r, i);
		}
		}
		break;
	default:
		xr_assert(false);
	}

	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_LINKS))
		xr_not_expected();

	switch(version) {
	case WAYOBJECT_VERSION:
		r.r_seq(r.r_u16(), path->links, way_link_io());
		break;
	case WAYOBJECT_VERSION_12:
		r.r_seq(r.r_u16(), path->links, way_link_io_12());
		break;
	default:
		xr_assert(false);
	}

	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_NAME))
		xr_not_expected();
	r.r_sz(path->name);
	r.debug_find_chunk();
}